

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineLayoutVk.cpp
# Opt level: O1

void __thiscall Diligent::PipelineLayoutVk::~PipelineLayoutVk(PipelineLayoutVk *this)

{
  string msg;
  string local_28;
  
  if ((this->m_VkPipelineLayout).m_VkObject != (VkPipelineLayout_T *)0x0) {
    FormatString<char[40]>(&local_28,(char (*) [40])"Pipeline layout have not been released!");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"~PipelineLayoutVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x33);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  VulkanUtilities::
  VulkanObjectWrapper<VkPipelineLayout_T_*,_(VulkanUtilities::VulkanHandleTypeId)11>::
  ~VulkanObjectWrapper(&this->m_VkPipelineLayout);
  return;
}

Assistant:

PipelineLayoutVk::~PipelineLayoutVk()
{
    VERIFY(!m_VkPipelineLayout, "Pipeline layout have not been released!");
}